

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O3

void __thiscall dh::trival::trival(trival *this,string *operand,trivalitem *val1)

{
  trivalitem::trivalitem(&this->_res);
  (this->_operand)._M_dataplus._M_p = (pointer)&(this->_operand).field_2;
  (this->_operand)._M_string_length = 0;
  (this->_operand).field_2._M_local_buf[0] = '\0';
  trivalitem::trivalitem(&this->_val1);
  trivalitem::trivalitem(&this->_val2);
  std::__cxx11::string::_M_assign((string *)&this->_operand);
  std::__cxx11::string::_M_assign((string *)&this->_val1);
  (this->_val1).type = val1->type;
  this->size = 1;
  return;
}

Assistant:

trival( ::std::string operand, trivalitem val1)
		{
			this->_operand = operand;
			this->_val1.name = val1.name;
			this->_val1.type = val1.type;
			size = 1;
		}